

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O2

string * __thiscall
wallet::PurposeToString_abi_cxx11_(string *__return_storage_ptr__,wallet *this,AddressPurpose p)

{
  allocator<char> *__a;
  int iVar1;
  char *__s;
  long in_FS_OFFSET;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (int)this;
  if (iVar1 == 2) {
    __s = "refund";
    __a = &local_13;
  }
  else if (iVar1 == 1) {
    __s = "send";
    __a = &local_12;
  }
  else {
    if (iVar1 != 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                    ,0x115,"std::string wallet::PurposeToString(AddressPurpose)");
    }
    __s = "receive";
    __a = &local_11;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline std::string PurposeToString(AddressPurpose p)
{
    switch(p) {
    case AddressPurpose::RECEIVE: return "receive";
    case AddressPurpose::SEND: return "send";
    case AddressPurpose::REFUND: return "refund";
    } // no default case so the compiler will warn when a new enum as added
    assert(false);
}